

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O2

void gz_compress(FILE *in,gzFile out)

{
  int iVar1;
  uint uVar2;
  int32_t iVar3;
  void *__ptr;
  size_t sVar4;
  char *__s;
  uint len;
  
  __ptr = calloc(0x4000,1);
  if (__ptr == (void *)0x0) {
    __s = "out of memory";
  }
  else {
    while( true ) {
      sVar4 = fread(__ptr,1,0x4000,(FILE *)in);
      iVar1 = ferror((FILE *)in);
      if (iVar1 != 0) break;
      len = (uint)sVar4;
      if (len == 0) goto LAB_001029b9;
      uVar2 = zng_gzwrite(out,__ptr,len);
      if (uVar2 != len) {
        gz_fatal(out);
LAB_001029b9:
        free(__ptr);
        fclose((FILE *)in);
        iVar3 = zng_gzclose(out);
        if (iVar3 != 0) {
          error("failed gzclose");
        }
        return;
      }
    }
    free(__ptr);
    __s = "fread";
  }
  perror(__s);
  exit(1);
}

Assistant:

static void gz_compress(FILE *in, gzFile out) {
    char *buf;
    int len;

#ifdef USE_MMAP
    /* Try first compressing with mmap. If mmap fails (minigzip used in a
     * pipe), use the normal fread loop.
     */
    if (gz_compress_mmap(in, out) == Z_OK) return;
#endif
    buf = (char *)calloc(BUFLEN, 1);
    if (buf == NULL) {
        perror("out of memory");
        exit(1);
    }

    for (;;) {
        len = (int)fread(buf, 1, BUFLEN, in);
        if (ferror(in)) {
            free(buf);
            perror("fread");
            exit(1);
        }
        if (len == 0) break;

        if (PREFIX(gzwrite)(out, buf, (unsigned)len) != len) gz_fatal(out);
    }
    free(buf);
    fclose(in);
    if (PREFIX(gzclose)(out) != Z_OK) error("failed gzclose");
}